

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::SimInfo(SimInfo *this,ForceField *ff,Globals *simParams)

{
  _Rb_tree_header *p_Var1;
  pointer ppIVar2;
  pointer ppTVar3;
  pointer ppBVar4;
  pointer ppIVar5;
  pointer ppTVar6;
  pointer ppBVar7;
  uint nmol;
  Component *pCVar8;
  MoleculeStamp *molStamp;
  pointer ppCVar9;
  CutoffGroupStamp *pCVar10;
  pointer ppRVar11;
  RigidBodyStamp *pRVar12;
  vector<int,_std::allocator<int>_> *pvVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  pointer ppCVar23;
  int iVar24;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> components;
  __shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2> local_48;
  uint_fast32_t seed;
  
  this->_vptr_SimInfo = (_func_int **)&PTR__SimInfo_002c1400;
  this->forceField_ = ff;
  this->simParams_ = simParams;
  this->ndf_ = 0;
  this->fdf_local = 0;
  this->ndfRaw_ = 0;
  this->ndfTrans_ = 0;
  this->nZconstraint_ = 0;
  (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>)0x0;
  this->nAtoms_ = 0;
  this->nBonds_ = 0;
  this->nBends_ = 0;
  this->nTorsions_ = 0;
  this->nInversions_ = 0;
  this->nRigidBodies_ = 0;
  this->nIntegrableObjects_ = 0;
  this->nCutoffGroups_ = 0;
  this->nGlobalBonds_ = 0;
  this->nGlobalBends_ = 0;
  this->nGlobalTorsions_ = 0;
  this->nGlobalInversions_ = 0;
  *(undefined8 *)((long)&this->nGlobalInversions_ + 1) = 0;
  this->nConstraints_ = 0;
  this->nFluctuatingCharges_ = 0;
  this->nGlobalMols_ = 0;
  this->nGlobalAtoms_ = 0;
  this->nGlobalCutoffGroups_ = 0;
  this->nGlobalIntegrableObjects_ = 0;
  this->nGlobalRigidBodies_ = 0;
  this->nGlobalFluctuatingCharges_ = 0;
  (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  p_Var1 = &(this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header;
  (this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&(this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xb0);
  (this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->excludedInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar13 = &(this->excludedInteractions_).pairList_;
  (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->excludedInteractions_).modified_ = false;
  (this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  p_Var1 = &(this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header;
  (this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->oneTwoInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar13 = &(this->oneTwoInteractions_).pairList_;
  (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->oneTwoInteractions_).modified_ = false;
  (this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  p_Var1 = &(this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header;
  (this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->oneThreeInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar13 = &(this->oneThreeInteractions_).pairList_;
  (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->oneThreeInteractions_).modified_ = false;
  (this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header;
  (this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->oneFourInteractions_).pairSet_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar13 = &(this->oneFourInteractions_).pairList_;
  (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->oneFourInteractions_).modified_ = false;
  (this->properties_)._vptr_PropertyMap = (_func_int **)&PTR__PropertyMap_002c1430;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  LocalIndexManager::LocalIndexManager(&this->localIndexMan_);
  (this->rawMetaData_)._M_dataplus._M_p = (pointer)&(this->rawMetaData_).field_2;
  (this->rawMetaData_)._M_string_length = 0;
  iVar15 = 0;
  (this->rawMetaData_).field_2._M_local_buf[0] = '\0';
  (this->finalConfigFileName_)._M_dataplus._M_p = (pointer)&(this->finalConfigFileName_).field_2;
  (this->finalConfigFileName_)._M_string_length = 0;
  (this->finalConfigFileName_).field_2._M_local_buf[0] = '\0';
  (this->dumpFileName_)._M_dataplus._M_p = (pointer)&(this->dumpFileName_).field_2;
  (this->dumpFileName_)._M_string_length = 0;
  (this->dumpFileName_).field_2._M_local_buf[0] = '\0';
  (this->statFileName_)._M_dataplus._M_p = (pointer)&(this->statFileName_).field_2;
  (this->statFileName_)._M_string_length = 0;
  (this->statFileName_).field_2._M_local_buf[0] = '\0';
  (this->reportFileName_)._M_dataplus._M_p = (pointer)&(this->reportFileName_).field_2;
  (this->reportFileName_)._M_string_length = 0;
  (this->reportFileName_).field_2._M_local_buf[0] = '\0';
  (this->restFileName_)._M_dataplus._M_p = (pointer)&(this->restFileName_).field_2;
  (this->restFileName_)._M_string_length = 0;
  (this->restFileName_).field_2._M_local_buf[0] = '\0';
  this->topologyDone_ = false;
  this->calcBoxDipole_ = false;
  this->calcBoxQuadrupole_ = false;
  this->useAtomicVirial_ = true;
  (this->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->IOIndexToIntegrableObject).
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->IOIndexToIntegrableObject).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->IOIndexToIntegrableObject).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::vector
            (&components,&simParams->components_);
  iVar19 = 0;
  iVar24 = 0;
  for (ppCVar23 = components.
                  super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      ppCVar23 !=
      components.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppCVar23 = ppCVar23 + 1) {
    pCVar8 = *ppCVar23;
    iVar14 = -1;
    if ((pCVar8->Region).super_ParameterBase.empty_ == false) {
      iVar14 = *(int *)&(pCVar8->Region).super_ParameterBase.field_0x2c;
    }
    molStamp = pCVar8->moleculeStamp_;
    molStamp->region_ = iVar14;
    nmol = *(uint *)&(pCVar8->NMol).super_ParameterBase.field_0x2c;
    addMoleculeStamp(this,molStamp,nmol);
    this->nGlobalAtoms_ =
         this->nGlobalAtoms_ +
         (int)((ulong)((long)(molStamp->atomStamps_).
                             super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(molStamp->atomStamps_).
                            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * nmol;
    ppIVar2 = (molStamp->inversionStamps_).
              super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppTVar3 = (molStamp->torsionStamps_).
              super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppBVar4 = (molStamp->bendStamps_).
              super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppIVar5 = (molStamp->inversionStamps_).
              super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar6 = (molStamp->torsionStamps_).
              super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppBVar7 = (molStamp->bendStamps_).
              super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    this->nGlobalBonds_ =
         (int)(((ulong)((long)(molStamp->bondStamps_).
                              super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(molStamp->bondStamps_).
                             super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff) *
              (ulong)nmol) + this->nGlobalBonds_;
    this->nGlobalBends_ =
         (int)(((ulong)((long)ppBVar4 - (long)ppBVar7) >> 3 & 0xffffffff) * (ulong)nmol) +
         this->nGlobalBends_;
    this->nGlobalTorsions_ =
         (int)(((ulong)((long)ppTVar3 - (long)ppTVar6) >> 3 & 0xffffffff) * (ulong)nmol) +
         this->nGlobalTorsions_;
    this->nGlobalInversions_ =
         (int)(((ulong)((long)ppIVar2 - (long)ppIVar5) >> 3 & 0xffffffff) * (ulong)nmol) +
         this->nGlobalInversions_;
    ppCVar9 = (molStamp->cutoffGroupStamps_).
              super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)((long)(molStamp->cutoffGroupStamps_).
                           super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar9) >> 3;
    uVar20 = 0;
    iVar14 = (int)uVar16;
    uVar22 = 0;
    if (0 < iVar14) {
      uVar22 = uVar16 & 0xffffffff;
    }
    iVar17 = 0;
    for (; uVar22 != uVar20; uVar20 = uVar20 + 1) {
      pCVar10 = ppCVar9[uVar20];
      iVar17 = iVar17 + (int)((ulong)((long)*(pointer *)
                                             ((long)&(pCVar10->members_).
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl + 8) -
                                     *(long *)&(pCVar10->members_).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data) >> 2);
    }
    ppRVar11 = (molStamp->rigidBodyStamps_).
               super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)((long)(molStamp->rigidBodyStamps_).
                           super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar11) >> 3;
    uVar20 = 0;
    iVar18 = (int)uVar16;
    uVar22 = 0;
    if (0 < iVar18) {
      uVar22 = uVar16 & 0xffffffff;
    }
    iVar21 = 0;
    for (; uVar22 != uVar20; uVar20 = uVar20 + 1) {
      pRVar12 = ppRVar11[uVar20];
      iVar21 = iVar21 + (int)((ulong)((long)*(pointer *)
                                             ((long)&(pRVar12->members_).
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl + 8) -
                                     *(long *)&(pRVar12->members_).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data) >> 2);
    }
    iVar15 = iVar14 * nmol + iVar15;
    iVar19 = iVar19 + iVar17 * nmol;
    this->nGlobalRigidBodies_ = this->nGlobalRigidBodies_ + iVar18 * nmol;
    iVar24 = iVar24 + iVar21 * nmol;
  }
  this->nGlobalCutoffGroups_ = (iVar15 - iVar19) + this->nGlobalAtoms_;
  this->nGlobalIntegrableObjects_ = (this->nGlobalAtoms_ - iVar24) + this->nGlobalRigidBodies_;
  iVar15 = (int)((ulong)((long)(this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  this->nGlobalMols_ = iVar15;
  std::vector<int,_std::allocator<int>_>::resize(&this->molToProcMap_,(long)iVar15);
  seed = 0x1571;
  if ((this->simParams_->Seed).super_ParameterBase.empty_ == false) {
    seed = (this->simParams_->Seed).data_;
  }
  std::make_shared<OpenMD::Utils::RandNumGen,unsigned_long&>((unsigned_long *)&local_48);
  std::__shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::_Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::~_Vector_base
            (&components.
              super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>);
  return;
}

Assistant:

SimInfo::SimInfo(ForceField* ff, Globals* simParams) :
      forceField_(ff), simParams_(simParams), randNumGen_ {nullptr}, nAtoms_(0),
      nBonds_(0), nBends_(0), nTorsions_(0), nInversions_(0), nRigidBodies_(0),
      nIntegrableObjects_(0), nCutoffGroups_(0), nConstraints_(0),
      nFluctuatingCharges_(0), nGlobalMols_(0), nGlobalAtoms_(0),
      nGlobalCutoffGroups_(0), nGlobalIntegrableObjects_(0),
      nGlobalRigidBodies_(0), nGlobalFluctuatingCharges_(0), nGlobalBonds_(0),
      nGlobalBends_(0), nGlobalTorsions_(0), nGlobalInversions_(0),
      nGlobalConstraints_(0), hasNGlobalConstraints_(false), ndf_(0),
      fdf_local(0), ndfRaw_(0), ndfTrans_(0), nZconstraint_(0), sman_(NULL),
      topologyDone_(false), calcBoxDipole_(false), calcBoxQuadrupole_(false),
      useAtomicVirial_(true) {
    MoleculeStamp* molStamp;
    int nMolWithSameStamp;
    int nCutoffAtoms = 0;  // number of atoms belong to cutoff groups
    int nGroups      = 0;  // total cutoff groups defined in meta-data file
    CutoffGroupStamp* cgStamp;
    RigidBodyStamp* rbStamp;
    int nRigidAtoms = 0;

    vector<Component*> components = simParams->getComponents();

    for (vector<Component*>::iterator i = components.begin();
         i != components.end(); ++i) {
      molStamp = (*i)->getMoleculeStamp();
      if ((*i)->haveRegion()) {
        molStamp->setRegion((*i)->getRegion());
      } else {
        // set the region to a disallowed value:
        molStamp->setRegion(-1);
      }

      nMolWithSameStamp = (*i)->getNMol();

      addMoleculeStamp(molStamp, nMolWithSameStamp);

      // calculate atoms in molecules
      nGlobalAtoms_ += molStamp->getNAtoms() * nMolWithSameStamp;
      nGlobalBonds_ += molStamp->getNBonds() * nMolWithSameStamp;
      nGlobalBends_ += molStamp->getNBends() * nMolWithSameStamp;
      nGlobalTorsions_ += molStamp->getNTorsions() * nMolWithSameStamp;
      nGlobalInversions_ += molStamp->getNInversions() * nMolWithSameStamp;

      // calculate atoms in cutoff groups
      int nAtomsInGroups       = 0;
      int nCutoffGroupsInStamp = molStamp->getNCutoffGroups();

      for (int j = 0; j < nCutoffGroupsInStamp; j++) {
        cgStamp = molStamp->getCutoffGroupStamp(j);
        nAtomsInGroups += cgStamp->getNMembers();
      }

      nGroups += nCutoffGroupsInStamp * nMolWithSameStamp;

      nCutoffAtoms += nAtomsInGroups * nMolWithSameStamp;

      // calculate atoms in rigid bodies
      int nAtomsInRigidBodies = 0;
      int nRigidBodiesInStamp = molStamp->getNRigidBodies();

      for (int j = 0; j < nRigidBodiesInStamp; j++) {
        rbStamp = molStamp->getRigidBodyStamp(j);
        nAtomsInRigidBodies += rbStamp->getNMembers();
      }

      nGlobalRigidBodies_ += nRigidBodiesInStamp * nMolWithSameStamp;
      nRigidAtoms += nAtomsInRigidBodies * nMolWithSameStamp;
    }

    // every free atom (atom does not belong to cutoff groups) is a cutoff
    // group therefore the total number of cutoff groups in the system is
    // equal to the total number of atoms minus number of atoms belong to
    // cutoff group defined in meta-data file plus the number of cutoff
    // groups defined in meta-data file

    nGlobalCutoffGroups_ = nGlobalAtoms_ - nCutoffAtoms + nGroups;

    // every free atom (atom does not belong to rigid bodies) is an
    // integrable object therefore the total number of integrable objects
    // in the system is equal to the total number of atoms minus number of
    // atoms belong to rigid body defined in meta-data file plus the number
    // of rigid bodies defined in meta-data file
    nGlobalIntegrableObjects_ =
        nGlobalAtoms_ - nRigidAtoms + nGlobalRigidBodies_;

    nGlobalMols_ = molStampIds_.size();
    molToProcMap_.resize(nGlobalMols_);

    // Initialize the random number generator on each processing
    // element using either the user-supplied seed or a default seed
    std::uint_fast32_t seed;

    if (simParams_->haveSeed())
      seed = static_cast<std::uint_fast32_t>(simParams_->getSeed());
    else
      seed = std::mt19937::default_seed;

    randNumGen_ = std::make_shared<Utils::RandNumGen>(seed);
  }